

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementMeta.cpp
# Opt level: O2

void Rml::ElementMetaPool::Shutdown(void)

{
  code *pcVar1;
  bool bVar2;
  ElementMetaPool *pEVar3;
  
  pEVar3 = ControlledLifetimeResource<Rml::ElementMetaPool>::operator->
                     ((ControlledLifetimeResource<Rml::ElementMetaPool> *)&element_meta_pool);
  if ((pEVar3->pool).num_allocated_objects == 0) {
    ControlledLifetimeResource<Rml::ElementMetaPool>::Shutdown
              ((ControlledLifetimeResource<Rml::ElementMetaPool> *)&element_meta_pool);
    return;
  }
  Log::Message(LT_ERROR,
               "Element meta pool not empty on shutdown, %d object(s) leaked. This will likely lead to a crash when element is destroyed. Ensure that no Rml::Element objects are kept alive in user space at the end of Rml::Shutdown."
              );
  bVar2 = Assert("RMLUI_ERROR",
                 "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementMeta.cpp"
                 ,0x35);
  if (bVar2) {
    element_meta_pool = 1;
    return;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void ElementMetaPool::Shutdown()
{
	const int num_objects = element_meta_pool->pool.GetNumAllocatedObjects();
	if (num_objects == 0)
	{
		element_meta_pool.Shutdown();
	}
	else
	{
		Log::Message(Log::LT_ERROR,
			"Element meta pool not empty on shutdown, %d object(s) leaked. This will likely lead to a crash when element is destroyed. Ensure that "
			"no Rml::Element objects are kept alive in user space at the end of Rml::Shutdown.",
			num_objects);
		RMLUI_ERROR;
		element_meta_pool.Leak();
	}
}